

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFloat
          (FastFieldValuePrinter *this,float val,BaseTextGenerator *generator)

{
  allocator local_2d;
  float local_2c;
  string local_28;
  
  local_2c = val;
  if (NAN(val)) {
    std::__cxx11::string::string((string *)&local_28,"nan",&local_2d);
  }
  else {
    SimpleFtoa_abi_cxx11_(&local_28,(protobuf *)generator,val);
  }
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_28._M_dataplus._M_p,local_28._M_string_length);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFloat(
    float val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? SimpleFtoa(val) : "nan");
}